

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O2

int __thiscall chrono::collision::CHOBBTree::BuildModel(CHOBBTree *this,double envelope)

{
  long lVar1;
  
  ChCollisionTree::BuildModel(&this->super_ChCollisionTree,envelope);
  if ((this->super_ChCollisionTree).build_state != ChC_BUILD_STATE_PROCESSED) {
    std::vector<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>::clear
              (&this->b);
    lVar1 = (long)(this->super_ChCollisionTree).num_geometries;
    if (lVar1 != 0) {
      std::vector<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>::resize
                (&this->b,lVar1 * 2 - 1);
      this->current_box = 0;
      build_model(this,envelope);
      (this->super_ChCollisionTree).build_state = ChC_BUILD_STATE_PROCESSED;
    }
  }
  return 0;
}

Assistant:

int CHOBBTree::BuildModel(double envelope) {
    // INHERIT PARENT CLASS RESET FUNCTION
    ChCollisionTree::BuildModel(envelope);

    if (build_state == ChC_BUILD_STATE_PROCESSED) {
        return ChC_OK;
    }

    // create an array of BVs for the model

    b.clear();

    if (num_geometries == 0)
        return ChC_OK;

    b.resize(2 * num_geometries - 1);

    current_box = 0;

    // we should build the model now.

    build_model(envelope);  // %%%%%%%%%%%% BUILD HIERARCHY HERE %%%%%%%%%%%

    build_state = ChC_BUILD_STATE_PROCESSED;

    return ChC_OK;
}